

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

bool open_prog_sewer_casket(OBJ_DATA *obj,CHAR_DATA *ch)

{
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *ch_00;
  
  *(byte *)(obj->value + 1) = (byte)obj->value[1] & 0xfb;
  send_to_char("You slide the heavy lid off the stone burial casket.\n\r",ch);
  act("$n slides the heavy lid off the stone burial casket.",ch,(void *)0x0,(void *)0x0,0);
  pMobIndex = get_mob_index(0x898);
  ch_00 = create_mobile(pMobIndex);
  char_to_room(ch_00,ch->in_room);
  act("Dust fills the burial chamber, and as it clears....",ch,(void *)0x0,(void *)0x0,4);
  act("$N rises out of the casket and lunges at you!",ch,(void *)0x0,ch_00,3);
  act("$N rises out of the casket and lunges at $n!",ch,(void *)0x0,ch_00,0);
  do_murder(ch_00,ch->name);
  return false;
}

Assistant:

bool open_prog_sewer_casket(OBJ_DATA *obj, CHAR_DATA *ch)
{
	CHAR_DATA *skeleton;

	REMOVE_BIT_OLD(obj->value[1], CONT_CLOSED);

	send_to_char("You slide the heavy lid off the stone burial casket.\n\r", ch);
	act("$n slides the heavy lid off the stone burial casket.", ch, 0, 0, TO_ROOM);

	skeleton = create_mobile(get_mob_index(2200));

	char_to_room(skeleton, ch->in_room);
	act("Dust fills the burial chamber, and as it clears....", ch, 0, 0, TO_ALL);
	act("$N rises out of the casket and lunges at you!", ch, 0, skeleton, TO_CHAR);
	act("$N rises out of the casket and lunges at $n!", ch, 0, skeleton, TO_ROOM);

	do_murder(skeleton, ch->name);

	return false;
}